

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to-renderscene-main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  char *pcVar9;
  int iVar10;
  char *pcVar11;
  ulong __val;
  long lVar12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  double local_2230;
  string obj_str;
  string mtl_str;
  string warn;
  string filepath;
  string err;
  string mtl_filename;
  string obj_filename;
  string usd_basedir;
  string local_2110;
  USDZAsset usdz_asset;
  AssetResolutionResolver arr;
  RenderScene render_scene;
  RenderSceneConverterEnv env;
  RenderSceneConverter converter;
  Stage stage;
  
  if (argc < 2) {
    poVar8 = std::operator<<((ostream *)&std::cout,"Usage: ");
    poVar8 = std::operator<<(poVar8,*argv);
    std::operator<<(poVar8," input.usd [OPTIONS].\n");
    std::operator<<((ostream *)&std::cout,"\n\nOptions\n\n");
    std::operator<<((ostream *)&std::cout,"  --timecode VALUE: Specify timecode value(e.g. 3.14)\n")
    ;
    std::operator<<((ostream *)&std::cout,"  --noidxbuild: Do not rebuild vertex indices\n");
    std::operator<<((ostream *)&std::cout,"  --notri: Do not triangulate mesh\n");
    std::operator<<((ostream *)&std::cout,"  --nousdprint: Do not print parsed USD\n");
    std::operator<<((ostream *)&std::cout,
                    "  --dumpobj: Dump mesh as wavefront .obj(for visual debugging)\n");
    std::operator<<((ostream *)&std::cout,"  --dumpusd: Dump scene as USD(USDA Ascii)\n");
    iVar10 = 1;
  }
  else {
    filepath._M_dataplus._M_p = (pointer)&filepath.field_2;
    filepath._M_string_length = 0;
    filepath.field_2._M_local_buf[0] = '\0';
    local_2230 = NAN;
    bVar1 = true;
    bVar3 = false;
    bVar4 = false;
    bVar6 = false;
    bVar2 = true;
    for (iVar10 = 1; iVar10 < argc; iVar10 = iVar10 + 1) {
      pcVar9 = argv[iVar10];
      iVar7 = strcmp(pcVar9,"--notri");
      if (iVar7 == 0) {
        bVar1 = false;
      }
      else {
        iVar7 = strcmp(pcVar9,"--noidxbuild");
        if (iVar7 == 0) {
          bVar2 = false;
        }
        else {
          iVar7 = strcmp(pcVar9,"--nousdprint");
          if (iVar7 == 0) {
            bVar6 = true;
          }
          else {
            iVar7 = strcmp(pcVar9,"--dumpobj");
            if (iVar7 == 0) {
              bVar3 = true;
            }
            else {
              iVar7 = strcmp(pcVar9,"--dumpusd");
              if (iVar7 == 0) {
                bVar4 = true;
              }
              else {
                iVar7 = strcmp(pcVar9,"--timecode");
                if (iVar7 == 0) {
                  iVar10 = iVar10 + 1;
                  if (argc <= iVar10) {
                    std::operator<<((ostream *)&std::cerr,"arg is missing for --timecode flag.\n");
                    iVar10 = -1;
                    goto LAB_001186c3;
                  }
                  std::__cxx11::string::string
                            ((string *)&stage,argv[iVar10],(allocator *)&converter);
                  local_2230 = std::__cxx11::stod((string *)&stage,(size_t *)0x0);
                  std::__cxx11::string::~string((string *)&stage);
                  std::operator<<((ostream *)&std::cout,"Use timecode: ");
                  poVar8 = std::ostream::_M_insert<double>(local_2230);
                  std::operator<<(poVar8,"\n");
                }
                else {
                  std::__cxx11::string::assign((char *)&filepath);
                }
              }
            }
          }
        }
      }
    }
    warn._M_dataplus._M_p = (pointer)&warn.field_2;
    warn._M_string_length = 0;
    warn.field_2._M_local_buf[0] = '\0';
    err._M_dataplus._M_p = (pointer)&err.field_2;
    err._M_string_length = 0;
    err.field_2._M_local_buf[0] = '\0';
    tinyusdz::Stage::Stage(&stage);
    bVar5 = tinyusdz::IsUSD((string *)&filepath,(string *)0x0);
    if (!bVar5) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"File not found or not a USD format: ");
      poVar8 = std::operator<<(poVar8,(string *)&filepath);
      std::operator<<(poVar8,"\n");
    }
    converter.root_nodeMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&converter.root_nodeMap._s_to_i;
    converter.root_nodeMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    converter.root_nodeMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    converter.root_nodeMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    converter.root_nodeMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)0x0;
    converter.root_nodeMap._i_to_s._M_t._M_impl._0_8_ = 0x4000ffffffff;
    converter.root_nodeMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_black;
    converter.root_nodeMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    converter.root_nodeMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x80000000400;
    converter.root_nodeMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)0x400000800;
    converter.root_nodeMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)0x0;
    converter.root_nodeMap._s_to_i._M_t._M_impl._0_8_ = 0;
    converter.root_nodeMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_node_count = 1;
    converter.root_nodeMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         converter.root_nodeMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    bVar5 = tinyusdz::LoadUSDFromFile
                      ((string *)&filepath,&stage,(string *)&warn,(string *)&err,
                       (USDLoadOptions *)&converter);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::FileFormatHandler>_>_>
                 *)&converter.root_nodeMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count)
    ;
    if (warn._M_string_length != 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"WARN : ");
      poVar8 = std::operator<<(poVar8,(string *)&warn);
      std::operator<<(poVar8,"\n");
    }
    if (err._M_string_length != 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"ERR : ");
      poVar8 = std::operator<<(poVar8,(string *)&err);
      std::operator<<(poVar8,"\n");
    }
    if (bVar5) {
      bVar5 = tinyusdz::IsUSDZ((string *)&filepath);
      if (!bVar6) {
        tinyusdz::Stage::ExportToString_abi_cxx11_((string *)&converter,&stage,false);
        poVar8 = std::operator<<((ostream *)&std::cout,(string *)&converter);
        std::operator<<(poVar8,"\n");
        poVar8 = std::operator<<((ostream *)&std::cout,"--------------------------------------");
        std::operator<<(poVar8,"\n");
        std::__cxx11::string::~string((string *)&converter);
      }
      tinyusdz::tydra::RenderScene::RenderScene(&render_scene);
      tinyusdz::tydra::RenderSceneConverter::RenderSceneConverter(&converter);
      tinyusdz::tydra::RenderSceneConverterEnv::RenderSceneConverterEnv(&env,&stage);
      poVar8 = std::operator<<((ostream *)&std::cout,"Triangulate : ");
      pcVar11 = "false";
      pcVar9 = "false";
      if (bVar1) {
        pcVar9 = "true";
      }
      poVar8 = std::operator<<(poVar8,pcVar9);
      std::operator<<(poVar8,"\n");
      env.mesh_config.triangulate = bVar1;
      poVar8 = std::operator<<((ostream *)&std::cout,"Rebuild vertex indices : ");
      if (bVar2) {
        pcVar11 = "true";
      }
      poVar8 = std::operator<<(poVar8,pcVar11);
      std::operator<<(poVar8,"\n");
      env.mesh_config.build_vertex_indices = bVar2;
      tinyusdz::io::GetBaseDir(&usd_basedir,&filepath);
      poVar8 = std::operator<<((ostream *)&std::cout,"Add seach path: ");
      poVar8 = std::operator<<(poVar8,(string *)&usd_basedir);
      std::operator<<(poVar8,"\n");
      usdz_asset.asset_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &usdz_asset.asset_map._M_t._M_impl.super__Rb_tree_header._M_header;
      usdz_asset.asset_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      usdz_asset.asset_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      usdz_asset.asset_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      usdz_asset.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      usdz_asset.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      usdz_asset.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      usdz_asset.addr = (uint8_t *)0x0;
      usdz_asset.size = 0;
      usdz_asset.asset_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           usdz_asset.asset_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (bVar5) {
        bVar6 = tinyusdz::ReadUSDZAssetInfoFromFile
                          ((string *)&filepath,&usdz_asset,(string *)&warn,(string *)&err,0x4000);
        if (!bVar6) {
          poVar8 = std::operator<<((ostream *)&std::cerr,"Failed to read USDZ assetInfo from file: "
                                  );
          poVar8 = std::operator<<(poVar8,(string *)&err);
          std::operator<<(poVar8,"\n");
LAB_00118774:
          exit(-1);
        }
        if (warn._M_string_length != 0) {
          poVar8 = std::operator<<((ostream *)&std::cout,(string *)&warn);
          std::operator<<(poVar8,"\n");
        }
        tinyusdz::AssetResolutionResolver::AssetResolutionResolver(&arr);
        bVar6 = tinyusdz::SetupUSDZAssetResolution(&arr,&usdz_asset);
        if (!bVar6) {
          std::operator<<((ostream *)&std::cerr,"Failed to setup AssetResolution for USDZ asset\n");
          goto LAB_00118774;
        }
        tinyusdz::AssetResolutionResolver::operator=(&env.asset_resolver,&arr);
        tinyusdz::AssetResolutionResolver::~AssetResolutionResolver(&arr);
      }
      else {
        std::__cxx11::string::string((string *)&arr,(string *)&usd_basedir);
        __l._M_len = 1;
        __l._M_array = (iterator)&arr;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&obj_str,__l,(allocator_type *)&mtl_str);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&env.asset_resolver._search_paths,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&obj_str);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&obj_str);
        std::__cxx11::string::~string((string *)&arr);
      }
      if (!NAN(local_2230)) {
        std::operator<<((ostream *)&std::cout,"Use timecode : ");
        poVar8 = std::ostream::_M_insert<double>(local_2230);
        std::operator<<(poVar8,"\n");
      }
      env.timecode = local_2230;
      bVar6 = tinyusdz::tydra::RenderSceneConverter::ConvertToRenderScene
                        (&converter,&env,&render_scene);
      if (bVar6) {
        if (converter._warn._M_string_length != 0) {
          poVar8 = std::operator<<((ostream *)&std::cout,"ConvertToRenderScene warn: ");
          poVar8 = std::operator<<(poVar8,(string *)&converter._warn);
          std::operator<<(poVar8,"\n");
        }
        std::__cxx11::string::string((string *)&obj_str,"kdl",(allocator *)&mtl_str);
        tinyusdz::tydra::DumpRenderScene((string *)&arr,&render_scene,&obj_str);
        poVar8 = std::operator<<((ostream *)&std::cout,(string *)&arr);
        std::operator<<(poVar8,"\n");
        std::__cxx11::string::~string((string *)&arr);
        std::__cxx11::string::~string((string *)&obj_str);
        if (bVar3) {
          std::operator<<((ostream *)&std::cout,"Dump RenderMesh as wavefront .obj\n");
          lVar12 = 0;
          for (__val = 0;
              __val < (ulong)(((long)render_scene.meshes.
                                     super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)render_scene.meshes.
                                    super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x520);
              __val = __val + 1) {
            obj_str._M_dataplus._M_p = (pointer)&obj_str.field_2;
            obj_str._M_string_length = 0;
            obj_str.field_2._M_local_buf[0] = '\0';
            mtl_str._M_dataplus._M_p = (pointer)&mtl_str.field_2;
            mtl_str._M_string_length = 0;
            mtl_str.field_2._M_local_buf[0] = '\0';
            bVar6 = tinyusdz::tydra::export_to_obj
                              (&render_scene,(int)__val,&obj_str,&mtl_str,&warn,&err);
            if (!bVar6) {
              poVar8 = std::operator<<((ostream *)&std::cerr,"obj export error: ");
              poVar8 = std::operator<<(poVar8,(string *)&err);
              std::operator<<(poVar8,"\n");
              goto LAB_00118774;
            }
            std::__cxx11::to_string(&mtl_filename,__val);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arr
                           ,&mtl_filename,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&((render_scene.meshes.
                                     super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->prim_name).
                                   _M_dataplus._M_p + lVar12));
            std::operator+(&obj_filename,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arr
                           ,".obj");
            std::__cxx11::string::~string((string *)&arr);
            std::__cxx11::string::~string((string *)&mtl_filename);
            std::__cxx11::to_string(&local_2110,__val);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arr
                           ,&local_2110,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&((render_scene.meshes.
                                     super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->prim_name).
                                   _M_dataplus._M_p + lVar12));
            std::operator+(&mtl_filename,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arr
                           ,".mtl");
            std::__cxx11::string::~string((string *)&arr);
            std::__cxx11::string::~string((string *)&local_2110);
            std::ofstream::ofstream(&arr,(string *)&obj_filename,_S_out);
            std::operator<<((ostream *)&arr,(string *)&obj_str);
            std::ofstream::~ofstream(&arr);
            std::ofstream::ofstream(&arr,(string *)&mtl_filename,_S_out);
            std::operator<<((ostream *)&arr,(string *)&mtl_str);
            std::ofstream::~ofstream(&arr);
            poVar8 = std::operator<<((ostream *)&std::cout,"  Wrote ");
            poVar8 = std::operator<<(poVar8,(string *)&obj_filename);
            std::operator<<(poVar8,"\n");
            std::__cxx11::string::~string((string *)&mtl_filename);
            std::__cxx11::string::~string((string *)&obj_filename);
            std::__cxx11::string::~string((string *)&mtl_str);
            std::__cxx11::string::~string((string *)&obj_str);
            lVar12 = lVar12 + 0x520;
          }
        }
        iVar10 = 0;
        if (bVar4) {
          tinyusdz::io::GetFileExtension(&obj_str,&filepath);
          tinyusdz::io::GetBaseFilename(&mtl_str,&filepath);
          tinyusdz::removeSuffix((string *)&arr,&mtl_str,&obj_str);
          std::operator+(&obj_filename,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arr,
                         "export.usda");
          std::__cxx11::string::~string((string *)&arr);
          mtl_filename._M_dataplus._M_p = (pointer)&mtl_filename.field_2;
          mtl_filename._M_string_length = 0;
          mtl_filename.field_2._M_local_buf[0] = '\0';
          bVar6 = tinyusdz::tydra::export_to_usda(&render_scene,&mtl_filename,&warn,&err);
          if (!bVar6) {
            poVar8 = std::operator<<((ostream *)&std::cerr,"Failed to export RenderScene to USDA: ")
            ;
            poVar8 = std::operator<<(poVar8,(string *)&err);
            std::operator<<(poVar8,"\n");
          }
          if (warn._M_string_length != 0) {
            poVar8 = std::operator<<((ostream *)&std::cout,"WARN: ");
            poVar8 = std::operator<<(poVar8,(string *)&warn);
            std::operator<<(poVar8,"\n");
          }
          std::ofstream::ofstream(&arr,(string *)&obj_filename,_S_out);
          std::operator<<((ostream *)&arr,(string *)&mtl_filename);
          std::ofstream::~ofstream(&arr);
          poVar8 = std::operator<<((ostream *)&std::cout,"Exported RenderScene as USDA: ");
          poVar8 = std::operator<<(poVar8,(string *)&obj_filename);
          std::operator<<(poVar8,"\n");
          std::__cxx11::string::~string((string *)&mtl_filename);
          std::__cxx11::string::~string((string *)&obj_filename);
          std::__cxx11::string::~string((string *)&mtl_str);
          std::__cxx11::string::~string((string *)&obj_str);
        }
      }
      else {
        poVar8 = std::operator<<((ostream *)&std::cerr,
                                 "Failed to convert USD Stage to RenderScene: \n");
        poVar8 = std::operator<<(poVar8,(string *)&converter._err);
        std::operator<<(poVar8,"\n");
        iVar10 = 1;
      }
      tinyusdz::USDZAsset::~USDZAsset(&usdz_asset);
      std::__cxx11::string::~string((string *)&usd_basedir);
      tinyusdz::tydra::RenderSceneConverterEnv::~RenderSceneConverterEnv(&env);
      tinyusdz::tydra::RenderSceneConverter::~RenderSceneConverter(&converter);
      tinyusdz::tydra::RenderScene::~RenderScene(&render_scene);
    }
    else {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Failed to load USD file: ");
      poVar8 = std::operator<<(poVar8,(string *)&filepath);
      std::operator<<(poVar8,"\n");
      iVar10 = 1;
    }
    tinyusdz::Stage::~Stage(&stage);
    std::__cxx11::string::~string((string *)&err);
    std::__cxx11::string::~string((string *)&warn);
LAB_001186c3:
    std::__cxx11::string::~string((string *)&filepath);
  }
  return iVar10;
}

Assistant:

int main(int argc, char **argv) {
  if (argc < 2) {
    std::cout << "Usage: " << argv[0] << " input.usd [OPTIONS].\n";
    std::cout << "\n\nOptions\n\n";
    std::cout << "  --timecode VALUE: Specify timecode value(e.g. 3.14)\n";
    std::cout << "  --noidxbuild: Do not rebuild vertex indices\n";
    std::cout << "  --notri: Do not triangulate mesh\n";
    std::cout << "  --nousdprint: Do not print parsed USD\n";
    std::cout
        << "  --dumpobj: Dump mesh as wavefront .obj(for visual debugging)\n";
    std::cout << "  --dumpusd: Dump scene as USD(USDA Ascii)\n";
    return EXIT_FAILURE;
  }

  // When Xform, Mesh, Material, etc. have time-varying values,
  // values are evaluated at `timecode` time(except for animation values in
  // SkelAnimation)
  double timecode = tinyusdz::value::TimeCode::Default();

  bool build_indices = true;
  bool triangulate = true;
  bool export_obj = false;
  bool export_usd = false;
  bool no_usdprint = false;

  std::string filepath;
  for (int i = 1; i < argc; i++) {
    if (strcmp(argv[i], "--notri") == 0) {
      triangulate = false;
    } else if (strcmp(argv[i], "--noidxbuild") == 0) {
      build_indices = false;
    } else if (strcmp(argv[i], "--nousdprint") == 0) {
      no_usdprint = true;
    } else if (strcmp(argv[i], "--dumpobj") == 0) {
      export_obj = true;
    } else if (strcmp(argv[i], "--dumpusd") == 0) {
      export_usd = true;
    } else if (strcmp(argv[i], "--timecode") == 0) {
      if ((i + 1) >= argc) {
        std::cerr << "arg is missing for --timecode flag.\n";
        return -1;
      }
      timecode = std::stod(argv[i + 1]);
      std::cout << "Use timecode: " << timecode << "\n";
      i++;
    } else {
      filepath = argv[i];
    }
  }

  std::string warn;
  std::string err;

  tinyusdz::Stage stage;

  if (!tinyusdz::IsUSD(filepath)) {
    std::cerr << "File not found or not a USD format: " << filepath << "\n";
  }

  bool ret = tinyusdz::LoadUSDFromFile(filepath, &stage, &warn, &err);
  if (!warn.empty()) {
    std::cerr << "WARN : " << warn << "\n";
  }

  if (!err.empty()) {
    std::cerr << "ERR : " << err << "\n";
  }

  if (!ret) {
    std::cerr << "Failed to load USD file: " << filepath << "\n";
    return EXIT_FAILURE;
  }

  bool is_usdz = tinyusdz::IsUSDZ(filepath);

  if (!no_usdprint) {
    std::string s = stage.ExportToString();
    std::cout << s << "\n";
    std::cout << "--------------------------------------"
              << "\n";
  }

  // RenderScene: Scene graph object which is suited for GL/Vulkan renderer
  tinyusdz::tydra::RenderScene render_scene;
  tinyusdz::tydra::RenderSceneConverter converter;
  tinyusdz::tydra::RenderSceneConverterEnv env(stage);

  std::cout << "Triangulate : " << (triangulate ? "true" : "false") << "\n";
  env.mesh_config.triangulate = triangulate;
  std::cout << "Rebuild vertex indices : " << (build_indices ? "true" : "false")
            << "\n";
  env.mesh_config.build_vertex_indices = build_indices;

  // Add base directory of .usd file to search path.
  std::string usd_basedir = tinyusdz::io::GetBaseDir(filepath);
  std::cout << "Add seach path: " << usd_basedir << "\n";

  tinyusdz::USDZAsset usdz_asset;
  if (is_usdz) {
    // Setup AssetResolutionResolver to read a asset(file) from memory.
    if (!tinyusdz::ReadUSDZAssetInfoFromFile(filepath, &usdz_asset, &warn,
                                             &err)) {
      std::cerr << "Failed to read USDZ assetInfo from file: " << err << "\n";
      exit(-1);
    }
    if (warn.size()) {
      std::cout << warn << "\n";
    }

    tinyusdz::AssetResolutionResolver arr;

    // NOTE: Pointer address of usdz_asset must be valid until the call of
    // RenderSceneConverter::ConvertToRenderScene.
    if (!tinyusdz::SetupUSDZAssetResolution(arr, &usdz_asset)) {
      std::cerr << "Failed to setup AssetResolution for USDZ asset\n";
      exit(-1);
    };

    env.asset_resolver = arr;

  } else {
    env.set_search_paths({usd_basedir});

    // TODO: Add example to set user-defined AssetResolutionResolver
    // AssetResolutionResolver arr;
    // ...
    // env.asset_resolver(arr);
  }

  if (!tinyusdz::value::TimeCode(timecode).is_default()) {
    std::cout << "Use timecode : " << timecode << "\n";
  }
  env.timecode = timecode;
  ret = converter.ConvertToRenderScene(env, &render_scene);
  if (!ret) {
    std::cerr << "Failed to convert USD Stage to RenderScene: \n"
              << converter.GetError() << "\n";
    return EXIT_FAILURE;
  }

  if (converter.GetWarning().size()) {
    std::cout << "ConvertToRenderScene warn: " << converter.GetWarning()
              << "\n";
  }

  std::cout << DumpRenderScene(render_scene) << "\n";

  if (export_obj) {
    std::cout << "Dump RenderMesh as wavefront .obj\n";
    for (size_t i = 0; i < render_scene.meshes.size(); i++) {
      std::string obj_str;
      std::string mtl_str;
      if (!tinyusdz::tydra::export_to_obj(render_scene, i, obj_str, mtl_str,
                                          &warn, &err)) {
        std::cerr << "obj export error: " << err << "\n";
        exit(-1);
      }

      std::string obj_filename =
          std::to_string(i) + render_scene.meshes[i].prim_name + ".obj";
      std::string mtl_filename =
          std::to_string(i) + render_scene.meshes[i].prim_name + ".mtl";
      {
        std::ofstream obj_ofs(obj_filename);
        obj_ofs << obj_str;
      }

      {
        std::ofstream mtl_ofs(mtl_filename);
        mtl_ofs << mtl_str;
      }
      std::cout << "  Wrote " << obj_filename << "\n";
    }
  }

  if (export_usd) {
    std::string ext = tinyusdz::io::GetFileExtension(filepath);
    std::string usd_basename = tinyusdz::io::GetBaseFilename(filepath);
    std::string usd_filename =
        tinyusdz::removeSuffix(usd_basename, ext) + "export.usda";

    std::string usda_str;
    if (!tinyusdz::tydra::export_to_usda(render_scene, usda_str, &warn, &err)) {
      std::cerr << "Failed to export RenderScene to USDA: " << err << "\n";
    }
    if (warn.size()) {
      std::cout << "WARN: " << warn << "\n";
    }

    {
      std::ofstream ofs(usd_filename);
      ofs << usda_str;
    }
    std::cout << "Exported RenderScene as USDA: " << usd_filename << "\n";
  }

  return EXIT_SUCCESS;
}